

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBComputeCumulativeSum
              (uint8_t *src_argb,int src_stride_argb,int32_t *dst_cumsum,int dst_stride32_cumsum,
              int width,int height)

{
  int iVar1;
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int32_t *previous_cumsum;
  _func_void_uint8_t_ptr_int32_t_ptr_int32_t_ptr_int *ComputeCumulativeSumRow;
  int y;
  code *local_38;
  int local_30;
  void *local_20;
  long local_10;
  int local_4;
  
  local_38 = ComputeCumulativeSumRow_C;
  if ((((in_RDX == (void *)0x0) || (in_RDI == 0)) || (in_R8D < 1)) || (in_R9D < 1)) {
    local_4 = -1;
  }
  else {
    iVar1 = libyuv::TestCpuFlag((int)((ulong)in_RDX >> 0x20));
    if (iVar1 != 0) {
      local_38 = ComputeCumulativeSumRow_SSE2;
    }
    memset(in_RDX,0,(long)in_R8D << 4);
    local_20 = in_RDX;
    local_10 = in_RDI;
    for (local_30 = 0; local_30 < in_R9D; local_30 = local_30 + 1) {
      (*local_38)(local_10,local_20,in_RDX,in_R8D);
      local_10 = local_10 + in_ESI;
      in_RDX = local_20;
      local_20 = (void *)((long)local_20 + (long)in_ECX * 4);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int ARGBComputeCumulativeSum(const uint8_t* src_argb,
                             int src_stride_argb,
                             int32_t* dst_cumsum,
                             int dst_stride32_cumsum,
                             int width,
                             int height) {
  int y;
  void (*ComputeCumulativeSumRow)(const uint8_t* row, int32_t* cumsum,
                                  const int32_t* previous_cumsum, int width) =
      ComputeCumulativeSumRow_C;
  int32_t* previous_cumsum = dst_cumsum;
  if (!dst_cumsum || !src_argb || width <= 0 || height <= 0) {
    return -1;
  }
#if defined(HAS_CUMULATIVESUMTOAVERAGEROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    ComputeCumulativeSumRow = ComputeCumulativeSumRow_SSE2;
  }
#endif
#if defined(HAS_CUMULATIVESUMTOAVERAGEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ComputeCumulativeSumRow = ComputeCumulativeSumRow_MMI;
  }
#endif

  memset(dst_cumsum, 0, width * sizeof(dst_cumsum[0]) * 4);  // 4 int per pixel.
  for (y = 0; y < height; ++y) {
    ComputeCumulativeSumRow(src_argb, dst_cumsum, previous_cumsum, width);
    previous_cumsum = dst_cumsum;
    dst_cumsum += dst_stride32_cumsum;
    src_argb += src_stride_argb;
  }
  return 0;
}